

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O3

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
::~UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
           *this)

{
  ~UnaryBuiltinVecFunc(this);
  operator_delete(this,200);
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::~UnaryBuiltinVecFunc (void)
{
	delete m_child;
}